

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::~SimpSolver(SimpSolver *this)

{
  char *pcVar1;
  int *piVar2;
  uint *puVar3;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_0011ad38;
  pcVar1 = (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
  if (pcVar1 != (char *)0x0) {
    (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(pcVar1);
    (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0
    ;
    (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  piVar2 = (this->frozen_vars).data;
  if (piVar2 != (int *)0x0) {
    (this->frozen_vars).sz = 0;
    free(piVar2);
    (this->frozen_vars).data = (int *)0x0;
    (this->frozen_vars).cap = 0;
  }
  pcVar1 = (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
  if (pcVar1 != (char *)0x0) {
    (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(pcVar1);
    (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
    (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  puVar3 = (this->subsumption_queue).buf.data;
  if (puVar3 != (uint *)0x0) {
    (this->subsumption_queue).buf.sz = 0;
    free(puVar3);
    (this->subsumption_queue).buf.data = (uint *)0x0;
    (this->subsumption_queue).buf.cap = 0;
  }
  piVar2 = (this->elim_heap).indices.map.data;
  if (piVar2 != (int *)0x0) {
    (this->elim_heap).indices.map.sz = 0;
    free(piVar2);
    (this->elim_heap).indices.map.data = (int *)0x0;
    (this->elim_heap).indices.map.cap = 0;
  }
  piVar2 = (this->elim_heap).heap.data;
  if (piVar2 != (int *)0x0) {
    (this->elim_heap).heap.sz = 0;
    free(piVar2);
    (this->elim_heap).heap.data = (int *)0x0;
    (this->elim_heap).heap.cap = 0;
  }
  piVar2 = (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.data;
  if (piVar2 != (int *)0x0) {
    (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.sz = 0;
    free(piVar2);
    (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.data = (int *)0x0;
    (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.cap = 0;
  }
  piVar2 = (this->occurs).dirties.data;
  if (piVar2 != (int *)0x0) {
    (this->occurs).dirties.sz = 0;
    free(piVar2);
    (this->occurs).dirties.data = (int *)0x0;
    (this->occurs).dirties.cap = 0;
  }
  pcVar1 = (this->occurs).dirty.map.data;
  if (pcVar1 != (char *)0x0) {
    (this->occurs).dirty.map.sz = 0;
    free(pcVar1);
    (this->occurs).dirty.map.data = (char *)0x0;
    (this->occurs).dirty.map.cap = 0;
  }
  vec<Minisat::vec<unsigned_int,_int>,_int>::clear
            ((vec<Minisat::vec<unsigned_int,_int>,_int> *)&this->occurs,true);
  pcVar1 = (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
  if (pcVar1 != (char *)0x0) {
    (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(pcVar1);
    (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
    (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  puVar3 = (this->elimclauses).data;
  if (puVar3 != (uint *)0x0) {
    (this->elimclauses).sz = 0;
    free(puVar3);
    (this->elimclauses).data = (uint *)0x0;
    (this->elimclauses).cap = 0;
  }
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

SimpSolver::~SimpSolver()
{
}